

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O0

int Omega_h::
    transform_reduce<Omega_h::IntIterator,Omega_h::max_exponent(Omega_h::Read<double>)::__0,int,Omega_h::maximum<int>>
              (int first,int last,int init,type *param_4)

{
  int local_84;
  __0 local_68 [8];
  type transform_local;
  type *transform_local_1;
  int init_local;
  int local_44;
  IntIterator last_local;
  IntIterator first_local;
  
  entering_parallel = 1;
  transform_local.a.write_.shared_alloc_.direct_ptr = param_4;
  init_local = last;
  local_44 = first;
  max_exponent(Omega_h::Read<double>)::$_0::__0(local_68,param_4);
  entering_parallel = 0;
  transform_local_1._0_4_ = init;
  for (; _last_local = &init_local, local_44 != init_local; local_44 = local_44 + 1) {
    local_84 = std::
               remove_reference<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp:504:20)_&>
               ::type::operator()(local_68,local_44);
    if (local_84 <= (int)transform_local_1) {
      local_84 = (int)transform_local_1;
    }
    transform_local_1._0_4_ = local_84;
  }
  max_exponent(Omega_h::Read<double>)::$_0::~__0(local_68);
  return (int)transform_local_1;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}